

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall Catch::Totals::operator-(Totals *this,Totals *other)

{
  size_t sVar1;
  size_t sVar2;
  Totals *in_RDI;
  
  in_RDI->error = 0;
  sVar1 = (this->assertions).failed;
  sVar2 = (other->assertions).failed;
  (in_RDI->assertions).passed = (this->assertions).passed - (other->assertions).passed;
  (in_RDI->assertions).failed = sVar1 - sVar2;
  sVar1 = (this->testCases).passed;
  sVar2 = (other->testCases).passed;
  (in_RDI->assertions).failedButOk =
       (this->assertions).failedButOk - (other->assertions).failedButOk;
  (in_RDI->testCases).passed = sVar1 - sVar2;
  sVar1 = (this->testCases).failedButOk;
  sVar2 = (other->testCases).failedButOk;
  (in_RDI->testCases).failed = (this->testCases).failed - (other->testCases).failed;
  (in_RDI->testCases).failedButOk = sVar1 - sVar2;
  return in_RDI;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }